

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

void Split_Conic(TPoint *base)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  base[4].x = base[2].x;
  lVar2 = base[1].y;
  lVar3 = base->x + base[1].x;
  lVar1 = base[1].x + base[2].x;
  base[3].x = lVar1 >> 1;
  base[2].x = lVar3 + lVar1 >> 2;
  base[1].x = lVar3 >> 1;
  base[4].y = base[2].y;
  lVar1 = base->y + lVar2;
  lVar2 = lVar2 + base[2].y;
  base[3].y = lVar2 >> 1;
  base[2].y = lVar1 + lVar2 >> 2;
  base[1].y = lVar1 >> 1;
  return;
}

Assistant:

static void
  Split_Conic( TPoint*  base )
  {
    Long  a, b;


    base[4].x = base[2].x;
    a = base[0].x + base[1].x;
    b = base[1].x + base[2].x;
    base[3].x = b >> 1;
    base[2].x = ( a + b ) >> 2;
    base[1].x = a >> 1;

    base[4].y = base[2].y;
    a = base[0].y + base[1].y;
    b = base[1].y + base[2].y;
    base[3].y = b >> 1;
    base[2].y = ( a + b ) >> 2;
    base[1].y = a >> 1;

    /* hand optimized.  gcc doesn't seem to be too good at common      */
    /* expression substitution and instruction scheduling ;-)          */
  }